

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_data_to_file.cpp
# Opt level: O3

void save_performance_file(benchmark_data *data,char *folder_name)

{
  char *pcVar1;
  FILE *__stream;
  
  pcVar1 = concat(folder_name,"/");
  pcVar1 = concat(pcVar1,(char *)(data + 0x108));
  puts(pcVar1);
  pcVar1 = concat(pcVar1,".csv");
  puts(pcVar1);
  __stream = fopen(pcVar1,"a+");
  printf("opened %s\n",pcVar1);
  fprintf(__stream,"%s,%d,%d,%d,%ld,%lu,%lu,%lu,%lf\n",data,(ulong)*(uint *)(data + 0x100),
          (ulong)*(uint *)(data + 0x104),(ulong)*(uint *)(data + 0x208),
          *(undefined8 *)(data + 0x210),*(undefined8 *)(data + 0x218),*(undefined8 *)(data + 0x220),
          *(undefined8 *)(data + 0x228));
  fclose(__stream);
  free(pcVar1);
  return;
}

Assistant:

void save_performance_file(const struct benchmark_data &data, char *folder_name) {
    char *path_name = concat(folder_name, "/");
    path_name = concat(path_name, data.function_name);

    printf("%s\n", path_name);
    path_name = concat(path_name, ".csv");
    printf("%s\n", path_name);

    // open the file for reading and appending - create it if necessary
    FILE *fp = fopen(path_name, "a+");
    printf("opened %s\n", path_name);
    fprintf(fp, "%s,%d,%d,%d,%ld,%" PRIu64 ",%" PRIu64 ",%" PRIu64 ",%lf\n", 
        data.image_name, 
        data.width,
        data.height, 
        data.num_interest_points, 
        data.num_flops, 
        data.avg_cycles, 
        data.min_cycles,
        data.max_cycles, 
        data.flops_per_cycle
    );

    // closes the file pointed to by fp
    fclose(fp);
    free(path_name);
}